

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O3

void xmrig::cryptonight_single_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  cryptonight_ctx *input_00;
  uint8_t *puVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  double dVar32;
  ulong uVar33;
  ulong uVar34;
  
  input_00 = *ctx;
  keccak(input,(int)size,input_00->state,200);
  cn_explode_scratchpad<true>((__m128i *)input_00,(__m128i *)input_00->memory);
  puVar5 = input_00->memory;
  uVar22 = *(ulong *)((long)input_00->state + 0x60);
  lVar24 = *(long *)((long)input_00->state + 0x68);
  fesetround(0x400);
  uVar21 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar21 != 0) {
    uVar33 = *(ulong *)((long)input_00->state + 0x20) ^ *(ulong *)input_00->state;
    uVar34 = *(ulong *)((long)input_00->state + 0x28) ^ *(longlong *)((long)input_00->state + 8);
    uVar27 = *(ulong *)((long)input_00->state + 0x30) ^ *(ulong *)((long)input_00->state + 0x10);
    uVar29 = *(ulong *)((long)input_00->state + 0x38) ^ *(ulong *)((long)input_00->state + 0x18);
    uVar30 = *(ulong *)((long)input_00->state + 0x40) ^ *(ulong *)((long)input_00->state + 0x50);
    uVar31 = *(ulong *)((long)input_00->state + 0x48) ^ *(ulong *)((long)input_00->state + 0x58);
    do {
      uVar28 = uVar29;
      uVar26 = uVar27;
      uVar16 = uVar33 & 0xffff0;
      uVar1 = *(uint *)(puVar5 + uVar16);
      uVar2 = *(uint *)(puVar5 + uVar16 + 4);
      uVar3 = *(uint *)(puVar5 + uVar16 + 8);
      uVar4 = *(uint *)(puVar5 + uVar16 + 0xc);
      uVar27 = CONCAT44(saes_table[1][uVar3 >> 8 & 0xff] ^ saes_table[0][uVar2 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar1 >> 0x16 & 0xfffffffc)),
                        saes_table[1][uVar2 >> 8 & 0xff] ^ saes_table[0][uVar1 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc))) ^
               uVar33;
      uVar29 = CONCAT44(saes_table[1][uVar1 >> 8 & 0xff] ^ saes_table[0][uVar4 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar3 >> 0x16 & 0xfffffffc)),
                        saes_table[1][uVar4 >> 8 & 0xff] ^ saes_table[0][uVar3 & 0xff] ^
                        *(uint *)((long)saes_table[2] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
                        *(uint *)((long)saes_table[3] + (ulong)(uVar2 >> 0x16 & 0xfffffffc))) ^
               uVar34;
      lVar9 = *(long *)((long)(puVar5 + (uVar16 ^ 0x30)) + 8);
      lVar10 = *(long *)(puVar5 + (uVar16 ^ 0x10));
      lVar11 = *(long *)((long)(puVar5 + (uVar16 ^ 0x10)) + 8);
      lVar12 = *(long *)(puVar5 + (uVar16 ^ 0x20));
      lVar13 = *(long *)((long)(puVar5 + (uVar16 ^ 0x20)) + 8);
      *(ulong *)(puVar5 + (uVar16 ^ 0x10)) = *(long *)(puVar5 + (uVar16 ^ 0x30)) + uVar30;
      *(ulong *)((long)(puVar5 + (uVar16 ^ 0x10)) + 8) = lVar9 + uVar31;
      *(ulong *)(puVar5 + (uVar16 ^ 0x20)) = lVar10 + uVar26;
      *(ulong *)((long)(puVar5 + (uVar16 ^ 0x20)) + 8) = lVar11 + uVar28;
      *(ulong *)(puVar5 + (uVar16 ^ 0x30)) = lVar12 + uVar33;
      *(ulong *)((long)(puVar5 + (uVar16 ^ 0x30)) + 8) = lVar13 + uVar34;
      *(ulong *)(puVar5 + uVar16) = uVar27 ^ uVar26;
      *(ulong *)((long)(puVar5 + uVar16) + 8) = uVar29 ^ uVar28;
      uVar20 = uVar27 & 0xffff0;
      uVar18 = lVar24 << 0x20 ^ uVar22 ^ *(ulong *)(puVar5 + uVar20);
      uVar22 = (ulong)(uint)((int)uVar27 + (int)lVar24 * 2) | 0x80000001;
      uVar22 = uVar29 % uVar22 << 0x20 | uVar29 / uVar22 & 0xffffffff;
      dVar32 = SQRT((double)(uVar22 + uVar27 >> 0xc | 0x3ff0000000000000));
      uVar16 = (ulong)dVar32 >> 0x14;
      uVar23 = (ulong)dVar32 >> 0x13;
      lVar24 = uVar23 + (((uVar23 - uVar16) + -0x3fdffffffff) * (uVar16 - 0x3fe00000000) <
                        uVar22 + uVar27);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar18;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar27;
      uVar19 = SUB168(auVar7 * auVar8,8);
      uVar17 = SUB168(auVar7 * auVar8,0);
      uVar14 = *(ulong *)(puVar5 + (uVar20 ^ 0x10));
      uVar15 = *(ulong *)((long)(puVar5 + (uVar20 ^ 0x10)) + 8);
      uVar25 = uVar20 ^ 0x20;
      uVar23 = *(ulong *)(puVar5 + uVar25);
      uVar6 = *(ulong *)(puVar5 + uVar25 + 8);
      lVar9 = *(long *)((long)(puVar5 + (uVar20 ^ 0x30)) + 8);
      lVar10 = *(long *)(puVar5 + uVar25);
      lVar11 = *(long *)((long)(puVar5 + uVar25) + 8);
      uVar16 = *(ulong *)(puVar5 + uVar20 + 8);
      *(ulong *)(puVar5 + (uVar20 ^ 0x10)) = uVar30 + *(long *)(puVar5 + (uVar20 ^ 0x30));
      *(ulong *)((long)(puVar5 + (uVar20 ^ 0x10)) + 8) = uVar31 + lVar9;
      *(ulong *)(puVar5 + uVar25) = (uVar19 ^ uVar14) + uVar26;
      *(ulong *)((long)(puVar5 + uVar25) + 8) = (uVar17 ^ uVar15) + uVar28;
      *(ulong *)(puVar5 + (uVar20 ^ 0x30)) = lVar10 + uVar33;
      *(ulong *)((long)(puVar5 + (uVar20 ^ 0x30)) + 8) = lVar11 + uVar34;
      uVar33 = (uVar19 ^ uVar23) + uVar33;
      uVar34 = (uVar17 ^ uVar6) + uVar34;
      *(ulong *)(puVar5 + uVar20) = uVar33;
      *(ulong *)((long)(puVar5 + uVar20) + 8) = uVar34;
      uVar33 = uVar18 ^ uVar33;
      uVar34 = uVar16 ^ uVar34;
      uVar21 = uVar21 - 1;
      uVar30 = uVar26;
      uVar31 = uVar28;
    } while (uVar21 != 0);
  }
  cn_implode_scratchpad<true>((__m128i *)input_00->memory,(__m128i *)input_00);
  keccakf((uint64_t *)input_00,0x18);
  switch((byte)*(longlong *)input_00->state & 3) {
  case 0:
    blake256_hash(output,input_00->state,200);
    return;
  case 1:
    groestl(input_00->state,0x640,output);
    return;
  case 2:
    jh_hash(0x100,input_00->state,0x640,output);
    return;
  case 3:
    xmr_skein(input_00->state,output);
    return;
  }
}

Assistant:

inline void cryptonight_single_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input, size, ctx[0]->state);
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->state), reinterpret_cast<__m128i *>(ctx[0]->memory));

    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint8_t *l0   = ctx[0]->memory;

    VARIANT2_INIT(0);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t al0  = h0[0] ^ h0[4];
    uint64_t ah0  = h0[1] ^ h0[5];
    uint64_t idx0 = al0;
    __m128i bx0   = _mm_set_epi64x(static_cast<int64_t>(h0[3] ^ h0[7]), static_cast<int64_t>(h0[2] ^ h0[6]));
    __m128i bx1   = _mm_set_epi64x(static_cast<int64_t>(h0[9] ^ h0[11]), static_cast<int64_t>(h0[8] ^ h0[10]));

    for (size_t i = 0; i < iters; i++) {
        __m128i cx;
        if (!SOFT_AES) {
            cx = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(static_cast<int64_t>(ah0), static_cast<int64_t>(al0));
        if (SOFT_AES) {
            cx = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx = _mm_aesenc_si128(cx, ax0);
        }

        cryptonight_monero_tweak(reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]), l0, idx0 & MASK, ax0, bx0, bx1, cx);

        idx0 = static_cast<uint64_t>(_mm_cvtsi128_si64(cx));

        uint64_t hi, lo, cl, ch;
        cl = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[0];
        ch = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[1];

        VARIANT2_INTEGER_MATH(0, cl, cx);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx0, bx1, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[0] = al0;
        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;
        bx1 = bx0;

        bx0 = cx;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->memory), reinterpret_cast<__m128i *>(ctx[0]->state));
    keccakf(h0, 24);
    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
}